

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

SequenceExprSyntax * __thiscall slang::parsing::Parser::parseSequencePrimary(Parser *this)

{
  Token openParen_00;
  Token first_match;
  Token closeParen_00;
  Token *closeParen_01;
  SequenceMatchListSyntax *expr_00;
  FirstMatchSequenceExprSyntax *pFVar1;
  SimpleSequenceExprSyntax *pSVar2;
  undefined8 in_RDI;
  Token TVar3;
  SequenceRepetitionSyntax *repetition;
  ExpressionSyntax *expr_2;
  SequenceExprSyntax *expr_1;
  Token openParen_1;
  SequenceMatchListSyntax *matchList;
  Token closeParen;
  SequenceExprSyntax *expr;
  Token openParen;
  Token keyword;
  TimingControlSyntax *event;
  Token current;
  SequenceExprSyntax *in_stack_00000158;
  Parser *in_stack_00000160;
  bool in_stack_000001f7;
  Parser *in_stack_000001f8;
  ParserBase *in_stack_fffffffffffffee8;
  Token *in_stack_fffffffffffffef0;
  Parser *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  ParserBase *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Info *in_stack_ffffffffffffff30;
  Parser *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff78;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff80;
  SequenceExprSyntax *in_stack_ffffffffffffffa0;
  Parser *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Info *in_stack_ffffffffffffffb8;
  Parser *this_00;
  TokenKind local_20;
  ClockingSequenceExprSyntax *local_8;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffff78 >> 0x30);
  TVar3 = ParserBase::peek(in_stack_fffffffffffffee8);
  local_20 = TVar3.kind;
  if (local_20 == OpenParenthesis) {
    ParserBase::consume(in_stack_ffffffffffffff10);
    parseSequenceExpr((Parser *)CONCAT26(local_20,in_stack_ffffffffffffff20),
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    TVar3.info = in_stack_ffffffffffffffb8;
    TVar3.kind = (short)in_stack_ffffffffffffffb0;
    TVar3._2_1_ = (char)((ulong)in_stack_ffffffffffffffb0 >> 0x10);
    TVar3.numFlags.raw = (char)((ulong)in_stack_ffffffffffffffb0 >> 0x18);
    TVar3.rawLen = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    local_8 = (ClockingSequenceExprSyntax *)
              parseParenthesizedSeqExpr(in_stack_ffffffffffffffa8,TVar3,in_stack_ffffffffffffffa0);
  }
  else if (local_20 == DoubleHash) {
    local_8 = (ClockingSequenceExprSyntax *)
              parseDelayedSequenceExpr(in_stack_00000160,in_stack_00000158);
  }
  else if (local_20 == At) {
    parseTimingControl(in_stack_000001f8,in_stack_000001f7);
    parseSequenceExpr((Parser *)CONCAT26(local_20,in_stack_ffffffffffffff20),
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    local_8 = slang::syntax::SyntaxFactory::clockingSequenceExpr
                        ((SyntaxFactory *)in_stack_fffffffffffffef0,
                         (TimingControlSyntax *)in_stack_fffffffffffffee8,
                         (SequenceExprSyntax *)0x6b0a3a);
  }
  else {
    if (local_20 != EdgeKeyword) {
      if (local_20 == FirstMatchKeyword) {
        ParserBase::consume(in_stack_ffffffffffffff10);
        TVar3 = ParserBase::expect(in_stack_ffffffffffffff80,kind);
        this_00 = TVar3._0_8_;
        closeParen_01 =
             (Token *)parseSequenceExpr((Parser *)CONCAT26(local_20,in_stack_ffffffffffffff20),
                                        (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0))
        ;
        Token::Token(in_stack_fffffffffffffef0);
        expr_00 = parseSequenceMatchList(this_00,closeParen_01);
        first_match.info = (Info *)in_stack_ffffffffffffff10;
        first_match.kind = (short)in_stack_ffffffffffffff08;
        first_match._2_1_ = (char)((ulong)in_stack_ffffffffffffff08 >> 0x10);
        first_match.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff08 >> 0x18);
        first_match.rawLen = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        openParen_00.info._0_4_ = in_stack_ffffffffffffff00;
        openParen_00._0_8_ = in_stack_ffffffffffffffa8;
        openParen_00.info._4_4_ = in_stack_ffffffffffffff04.m_bits;
        closeParen_00.info = in_stack_ffffffffffffff30;
        closeParen_00.kind = (short)in_stack_ffffffffffffff28;
        closeParen_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff28 >> 0x10);
        closeParen_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff28 >> 0x18);
        closeParen_00.rawLen = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        pFVar1 = slang::syntax::SyntaxFactory::firstMatchSequenceExpr
                           ((SyntaxFactory *)in_stack_ffffffffffffffa0,first_match,openParen_00,
                            (SequenceExprSyntax *)expr_00,
                            (SequenceMatchListSyntax *)CONCAT26(local_20,in_stack_ffffffffffffff20),
                            closeParen_00);
        return &pFVar1->super_SequenceExprSyntax;
      }
      if ((local_20 != NegEdgeKeyword) && (local_20 != PosEdgeKeyword)) {
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                  ((bitmask<slang::parsing::detail::ExpressionOptions> *)&stack0xffffffffffffff34,
                   SequenceExpr);
        parseExpressionOrDist(in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
        parseSequenceRepetition((Parser *)TVar3.info);
        pSVar2 = slang::syntax::SyntaxFactory::simpleSequenceExpr
                           ((SyntaxFactory *)in_stack_fffffffffffffef0,
                            (ExpressionSyntax *)in_stack_fffffffffffffee8,
                            (SequenceRepetitionSyntax *)0x6b0c46);
        return &pSVar2->super_SequenceExprSyntax;
      }
    }
    local_8 = (ClockingSequenceExprSyntax *)parseSignalEvent(in_stack_ffffffffffffff40);
  }
  return &local_8->super_SequenceExprSyntax;
}

Assistant:

SequenceExprSyntax& Parser::parseSequencePrimary() {
    auto current = peek();
    switch (current.kind) {
        case TokenKind::DoubleHash:
            return parseDelayedSequenceExpr(nullptr);
        case TokenKind::At: {
            auto event = parseTimingControl(/* inAssertion */ true);
            SLANG_ASSERT(event);
            return factory.clockingSequenceExpr(*event,
                                                parseSequenceExpr(0, /* isInProperty */ false));
        }
        case TokenKind::FirstMatchKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);

            Token closeParen;
            auto matchList = parseSequenceMatchList(closeParen);
            return factory.firstMatchSequenceExpr(keyword, openParen, expr, matchList, closeParen);
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
            return parseParenthesizedSeqExpr(openParen, expr);
        }
        case TokenKind::EdgeKeyword:
        case TokenKind::NegEdgeKeyword:
        case TokenKind::PosEdgeKeyword:
            return parseSignalEvent();
        default: {
            auto& expr = parseExpressionOrDist(ExpressionOptions::SequenceExpr);
            auto repetition = parseSequenceRepetition();
            return factory.simpleSequenceExpr(expr, repetition);
        }
    }
}